

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

Expression *
slang::ast::DataTypeExpression::fromSyntax
          (Compilation *compilation,DataTypeSyntax *syntax,ASTContext *context)

{
  ulong uVar1;
  Type *args_1;
  Expression *pEVar2;
  Type *args;
  TypeReferenceExpression *pTVar3;
  SourceRange sourceRange;
  SourceRange local_30;
  
  args_1 = Compilation::getType(compilation,syntax,context,(Type *)0x0);
  uVar1 = (context->flags).m_bits;
  if (((uint)uVar1 >> 0x11 & 1) == 0 ||
      (syntax->super_ExpressionSyntax).super_SyntaxNode.kind != TypeReference) {
    if ((uVar1 & 4) == 0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,(DiagCode)0x10001,sourceRange);
      pEVar2 = Expression::badExpr(compilation,(Expression *)0x0);
      return pEVar2;
    }
    local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pTVar3 = (TypeReferenceExpression *)
             BumpAllocator::
             emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,args_1,&local_30);
  }
  else {
    args = Compilation::getTypeRefType(compilation);
    local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pTVar3 = BumpAllocator::
             emplace<slang::ast::TypeReferenceExpression,slang::ast::Type_const&,slang::ast::Type_const&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,args,args_1,&local_30);
  }
  return &pTVar3->super_Expression;
}

Assistant:

Expression& DataTypeExpression::fromSyntax(Compilation& compilation, const DataTypeSyntax& syntax,
                                           const ASTContext& context) {
    const Type& type = compilation.getType(syntax, context);
    if (syntax.kind == SyntaxKind::TypeReference &&
        context.flags.has(ASTFlags::AllowTypeReferences)) {
        return *compilation.emplace<TypeReferenceExpression>(compilation.getTypeRefType(), type,
                                                             syntax.sourceRange());
    }

    if (!context.flags.has(ASTFlags::AllowDataType)) {
        context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<DataTypeExpression>(type, syntax.sourceRange());
}